

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usd-export.cc
# Opt level: O2

bool tinyusdz::tydra::export_to_usda(RenderScene *scene,string *usda_str,string *warn,string *err)

{
  SkelNode *node;
  size_type *this;
  size_type *this_00;
  VertexVariability VVar1;
  int iVar2;
  uint32_t uVar3;
  pointer paVar4;
  pointer puVar5;
  pointer pRVar6;
  pointer pSVar7;
  _Base_ptr p_Var8;
  bool bVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar10;
  long lVar11;
  size_t sVar12;
  ostream *poVar13;
  size_type sVar14;
  mapped_type *this_01;
  mapped_type *pmVar15;
  _Base_ptr *pp_Var16;
  _Rb_tree_node_base *p_Var17;
  size_type sVar18;
  mapped_type *this_02;
  value_type *pvVar19;
  _Base_ptr p_Var20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  pointer pRVar21;
  ulong uVar22;
  string *psVar23;
  size_t i;
  ulong uVar24;
  Interpolation IVar25;
  long lVar26;
  long lVar27;
  BlendShape *prim;
  GeomSubset *prim_00;
  GeomMesh *this_03;
  size_t i_3;
  size_t i_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar28;
  RenderMesh *this_04;
  __node_base *p_Var29;
  bool bVar30;
  bool bVar31;
  vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> displayColor;
  string *err_local;
  vector<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_> bss;
  vector<int,_std::allocator<int>_> fvCounts;
  allocator local_984d;
  uint32_t skel_id;
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> points;
  size_t num_joints;
  vector<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_> subsets;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> restTransforms;
  unordered_map<unsigned_int,_tinyusdz::Skeleton,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>_>
  skelMap;
  string skel_name;
  Prim meshPrim;
  GeomPrimvar geomBindTransform;
  Prim skelRootPrim;
  GeomPrimvar displayColorPvar;
  optional<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
  local_8778 [160];
  optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>> local_86d8 [432];
  optional<std::vector<int,std::allocator<int>>> local_8528 [160];
  optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>> local_8488 [576];
  string local_8248 [16];
  optional<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
  local_8238 [176];
  optional<std::__cxx11::string> local_8188 [648];
  undefined1 local_7f00 [928];
  optional<tinyusdz::Animatable<std::vector<int,std::allocator<int>>>> local_7b60 [2136];
  optional<tinyusdz::APISchemas> local_7308 [19];
  GeomMesh mesh;
  Stage stage;
  SkelRoot skelRoot;
  
  err_local = err;
  Stage::Stage(&stage);
  ::std::__cxx11::string::string
            ((string *)&mesh,"Exported from TinyUSDZ Tydra.",(allocator *)&displayColorPvar);
  ::std::__cxx11::string::_M_assign((string *)&stage.stage_metas.comment);
  ::std::__cxx11::string::_M_dispose();
  psVar23 = &(scene->meta).upAxis;
  bVar9 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            psVar23,"X");
  if (bVar9) {
    mesh.super_GPrim.super_Xformable.xformOps.
    super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
  }
  else {
    bVar9 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              psVar23,"Y");
    if (bVar9) {
      mesh.super_GPrim.super_Xformable.xformOps.
      super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 1;
    }
    else {
      bVar9 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )psVar23,"Z");
      if (!bVar9) goto LAB_00275555;
      mesh.super_GPrim.super_Xformable.xformOps.
      super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 2;
    }
  }
  TypedAttributeWithFallback<tinyusdz::Axis>::operator=(&stage.stage_metas.upAxis,(Axis *)&mesh);
LAB_00275555:
  SkelRoot::SkelRoot(&skelRoot);
  ::std::__cxx11::string::string((string *)&mesh,"skelRoot",(allocator *)&displayColorPvar);
  ::std::__cxx11::string::_M_assign((string *)&skelRoot.name);
  ::std::__cxx11::string::_M_dispose();
  Prim::Prim<tinyusdz::SkelRoot>(&skelRootPrim,&skelRoot);
  skelMap._M_h._M_buckets = &skelMap._M_h._M_single_bucket;
  skelMap._M_h._M_bucket_count = 1;
  skelMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  skelMap._M_h._M_element_count = 0;
  skelMap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  skelMap._M_h._M_rehash_policy._M_next_resize = 0;
  skelMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
  uVar22 = 0;
  bVar9 = false;
  while( true ) {
    if ((ulong)(((long)(scene->meshes).
                       super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(scene->meshes).
                      super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x520) <= uVar22) break;
    GeomMesh::GeomMesh(&mesh);
    psVar23 = err_local;
    subsets.super__Vector_base<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    subsets.super__Vector_base<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    subsets.super__Vector_base<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_04 = (scene->meshes).
              super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar22;
    pvVar10 = RenderMesh::faceVertexCounts(this_04);
    ::std::vector<int,_std::allocator<int>_>::vector
              (&fvCounts,
               (long)(pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 2,
               (allocator_type *)&displayColorPvar);
    for (uVar24 = 0; pvVar10 = RenderMesh::faceVertexCounts(this_04),
        uVar24 < (ulong)((long)(pvVar10->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar10->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 2); uVar24 = uVar24 + 1)
    {
      pvVar10 = RenderMesh::faceVertexCounts(this_04);
      fvCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar24] =
           (pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar24];
    }
    Animatable<std::vector<int,_std::allocator<int>_>_>::Animatable
              ((Animatable<std::vector<int,_std::allocator<int>_>_> *)&displayColorPvar,&fvCounts);
    nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<int,std::allocator<int>>>>::
    operator=((optional<tinyusdz::Animatable<std::vector<int,std::allocator<int>>>> *)
              &mesh.faceVertexCounts._attrib,
              (Animatable<std::vector<int,_std::allocator<int>_>_> *)&displayColorPvar);
    Animatable<std::vector<int,_std::allocator<int>_>_>::~Animatable
              ((Animatable<std::vector<int,_std::allocator<int>_>_> *)&displayColorPvar);
    pvVar10 = RenderMesh::faceVertexIndices(this_04);
    ::std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&bss,
               (long)(pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start >> 2,
               (allocator_type *)&displayColorPvar);
    for (uVar24 = 0; pvVar10 = RenderMesh::faceVertexIndices(this_04),
        uVar24 < (ulong)((long)(pvVar10->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar10->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 2); uVar24 = uVar24 + 1)
    {
      pvVar10 = RenderMesh::faceVertexIndices(this_04);
      *(uint *)((long)&((bss.
                         super__Vector_base<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_>
                         ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
               uVar24 * 4) =
           (pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar24];
    }
    Animatable<std::vector<int,_std::allocator<int>_>_>::Animatable
              ((Animatable<std::vector<int,_std::allocator<int>_>_> *)&displayColorPvar,
               (vector<int,_std::allocator<int>_> *)&bss);
    nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<int,std::allocator<int>>>>::
    operator=((optional<tinyusdz::Animatable<std::vector<int,std::allocator<int>>>> *)
              &mesh.faceVertexIndices._attrib,
              (Animatable<std::vector<int,_std::allocator<int>_>_> *)&displayColorPvar);
    Animatable<std::vector<int,_std::allocator<int>_>_>::~Animatable
              ((Animatable<std::vector<int,_std::allocator<int>_>_> *)&displayColorPvar);
    ::std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::vector
              (&points,((long)(this_04->points).
                              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this_04->points).
                             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0xc,
               (allocator_type *)&displayColorPvar);
    paVar4 = (this_04->points).
             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar11 = ((long)(this_04->points).
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)paVar4) / 0xc;
    lVar26 = 8;
    while (bVar30 = lVar11 != 0, lVar11 = lVar11 + -1, bVar30) {
      *(undefined4 *)
       ((long)points.
              super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
              ._M_impl.super__Vector_impl_data._M_start + lVar26 + -8) =
           *(undefined4 *)((long)paVar4->_M_elems + lVar26 + -8);
      *(undefined4 *)
       ((long)points.
              super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
              ._M_impl.super__Vector_impl_data._M_start + lVar26 + -4) =
           *(undefined4 *)((long)paVar4->_M_elems + lVar26 + -4);
      *(undefined4 *)
       ((long)&(points.
                super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                ._M_impl.super__Vector_impl_data._M_start)->x + lVar26) =
           *(undefined4 *)((long)paVar4->_M_elems + lVar26);
      lVar26 = lVar26 + 0xc;
    }
    Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>::
    Animatable((Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
                *)&displayColorPvar,&points);
    nonstd::optional_lite::
    optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>>
    ::operator=((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>>
                 *)&mesh.points._attrib,
                (Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
                 *)&displayColorPvar);
    Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>::
    ~Animatable((Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
                 *)&displayColorPvar);
    ::std::__cxx11::string::_M_assign((string *)&mesh.super_GPrim.name);
    if ((this_04->display_name)._M_string_length != 0) {
      nonstd::optional_lite::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::string> *)&mesh.super_GPrim.meta.displayName,
                 &this_04->display_name);
    }
    if ((this_04->vertex_colors).data.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this_04->vertex_colors).data.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_00275a8b:
      if ((this_04->vertex_opacities).data.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (this_04->vertex_opacities).data.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        sVar12 = VertexAttribute::vertex_count(&this_04->vertex_opacities);
        ::std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)&displayColor,sVar12,
                   (allocator_type *)&displayColorPvar);
        puVar5 = (this_04->vertex_opacities).data.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (uVar24 = 0; sVar12 = VertexAttribute::vertex_count(&this_04->vertex_opacities),
            uVar24 < sVar12; uVar24 = uVar24 + 1) {
          (&(displayColor.
             super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
             ._M_impl.super__Vector_impl_data._M_start)->r)[uVar24] =
               *(float *)(puVar5 + uVar24 * 4);
        }
        GeomPrimvar::GeomPrimvar(&displayColorPvar);
        ::std::__cxx11::string::string
                  ((string *)&meshPrim,"displayOpacity",(allocator *)&geomBindTransform);
        ::std::__cxx11::string::_M_assign((string *)&displayColorPvar);
        ::std::__cxx11::string::_M_dispose();
        GeomPrimvar::set_value<std::vector<float,std::allocator<float>>>
                  (&displayColorPvar,(vector<float,_std::allocator<float>_> *)&displayColor);
        VVar1 = (this_04->vertex_opacities).variability;
        IVar25 = FaceVarying;
        if (((VVar1 != FaceVarying) && (IVar25 = Vertex, (VVar1 & ~Uniform) != Varying)) &&
           (IVar25 = Uniform, VVar1 != Constant)) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&meshPrim);
          poVar13 = ::std::operator<<((ostream *)&meshPrim,"[error]");
          poVar13 = ::std::operator<<(poVar13,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                     );
          poVar13 = ::std::operator<<(poVar13,":");
          poVar13 = ::std::operator<<(poVar13,"ToGeomMesh");
          poVar13 = ::std::operator<<(poVar13,"():");
          poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x27e);
          ::std::operator<<(poVar13," ");
          poVar13 = ::std::operator<<((ostream *)&meshPrim,
                                      "Invalid variability in RenderMesh.vertex_opacities");
          ::std::operator<<(poVar13,"\n");
          if (psVar23 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+(&geomBindTransform._name,&skel_name,"\n");
            ::std::__cxx11::string::append((string *)psVar23);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&meshPrim);
          GeomPrimvar::~GeomPrimvar(&displayColorPvar);
          ::std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                    ((_Vector_base<float,_std::allocator<float>_> *)&displayColor);
          goto LAB_002760ef;
        }
        GeomPrimvar::set_interpolation(&displayColorPvar,IVar25);
        GPrim::set_primvar(&mesh.super_GPrim,&displayColorPvar,(string *)0x0);
        GeomPrimvar::~GeomPrimvar(&displayColorPvar);
        ::std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                  ((_Vector_base<float,_std::allocator<float>_> *)&displayColor);
      }
      if ((this_04->normals).data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (this_04->normals).data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        sVar12 = VertexAttribute::vertex_count(&this_04->normals);
        ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::vector
                  ((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                   &displayColor,sVar12,(allocator_type *)&displayColorPvar);
        puVar5 = (this_04->normals).data.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar26 = 8;
        for (uVar24 = 0; sVar12 = VertexAttribute::vertex_count(&this_04->normals), uVar24 < sVar12;
            uVar24 = uVar24 + 1) {
          *(undefined4 *)
           ((long)displayColor.
                  super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar26 + -8) =
               *(undefined4 *)(puVar5 + lVar26 + -8);
          *(undefined4 *)
           ((long)displayColor.
                  super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar26 + -4) =
               *(undefined4 *)(puVar5 + lVar26 + -4);
          *(undefined4 *)
           ((long)&(displayColor.
                    super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                    ._M_impl.super__Vector_impl_data._M_start)->r + lVar26) =
               *(undefined4 *)(puVar5 + lVar26);
          lVar26 = lVar26 + 0xc;
        }
        GeomPrimvar::GeomPrimvar(&displayColorPvar);
        ::std::__cxx11::string::string
                  ((string *)&meshPrim,"normals",(allocator *)&geomBindTransform);
        ::std::__cxx11::string::_M_assign((string *)&displayColorPvar);
        ::std::__cxx11::string::_M_dispose();
        GeomPrimvar::
        set_value<std::vector<tinyusdz::value::normal3f,std::allocator<tinyusdz::value::normal3f>>>
                  (&displayColorPvar,
                   (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                   &displayColor);
        VVar1 = (this_04->normals).variability;
        IVar25 = FaceVarying;
        if (((VVar1 != FaceVarying) && (IVar25 = Vertex, (VVar1 & ~Uniform) != Varying)) &&
           (IVar25 = Uniform, VVar1 != Constant)) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&meshPrim);
          poVar13 = ::std::operator<<((ostream *)&meshPrim,"[error]");
          poVar13 = ::std::operator<<(poVar13,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                     );
          poVar13 = ::std::operator<<(poVar13,":");
          poVar13 = ::std::operator<<(poVar13,"ToGeomMesh");
          poVar13 = ::std::operator<<(poVar13,"():");
          poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x29d);
          ::std::operator<<(poVar13," ");
          poVar13 = ::std::operator<<((ostream *)&meshPrim,
                                      "Invalid variability in RenderMesh.normals");
          ::std::operator<<(poVar13,"\n");
          if (psVar23 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+(&geomBindTransform._name,&skel_name,"\n");
            ::std::__cxx11::string::append((string *)psVar23);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&meshPrim);
          GeomPrimvar::~GeomPrimvar(&displayColorPvar);
          ::std::_Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
          ::~_Vector_base((_Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                           *)&displayColor);
          goto LAB_002760ef;
        }
        GeomPrimvar::set_interpolation(&displayColorPvar,IVar25);
        GPrim::set_primvar(&mesh.super_GPrim,&displayColorPvar,(string *)0x0);
        GeomPrimvar::~GeomPrimvar(&displayColorPvar);
        ::std::_Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                       *)&displayColor);
      }
      displayColorPvar._name._M_dataplus._M_p._0_4_ = 0;
      sVar14 = ::std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::count(&(this_04->texcoords)._M_h,(key_type_conflict1 *)&displayColorPvar);
      if (sVar14 != 0) {
        displayColorPvar._name._M_dataplus._M_p._0_4_ = 0;
        this_01 = ::std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::tydra::VertexAttribute>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)&this_04->texcoords,(key_type *)&displayColorPvar);
        sVar12 = VertexAttribute::vertex_count(this_01);
        ::std::vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
        vector((vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_> *)
               &displayColor,sVar12,(allocator_type *)&displayColorPvar);
        puVar5 = (this_01->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        for (uVar24 = 0; sVar12 = VertexAttribute::vertex_count(this_01), uVar24 < sVar12;
            uVar24 = uVar24 + 1) {
          (&(displayColor.
             super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
             ._M_impl.super__Vector_impl_data._M_start)->r)[uVar24 * 2] =
               *(float *)(puVar5 + uVar24 * 8);
          (&(displayColor.
             super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
             ._M_impl.super__Vector_impl_data._M_start)->g)[uVar24 * 2] =
               *(float *)(puVar5 + uVar24 * 8 + 4);
        }
        GeomPrimvar::GeomPrimvar(&displayColorPvar);
        ::std::__cxx11::string::_M_assign((string *)&displayColorPvar);
        GeomPrimvar::
        set_value<std::vector<tinyusdz::value::texcoord2f,std::allocator<tinyusdz::value::texcoord2f>>>
                  (&displayColorPvar,
                   (vector<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                    *)&displayColor);
        VVar1 = this_01->variability;
        IVar25 = FaceVarying;
        if (((VVar1 != FaceVarying) && (IVar25 = Vertex, (VVar1 & ~Uniform) != Varying)) &&
           (IVar25 = Uniform, VVar1 != Constant)) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&meshPrim);
          poVar13 = ::std::operator<<((ostream *)&meshPrim,"[error]");
          poVar13 = ::std::operator<<(poVar13,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                     );
          poVar13 = ::std::operator<<(poVar13,":");
          poVar13 = ::std::operator<<(poVar13,"ToGeomMesh");
          poVar13 = ::std::operator<<(poVar13,"():");
          poVar13 = (ostream *)::std::ostream::operator<<(poVar13,700);
          ::std::operator<<(poVar13," ");
          poVar13 = ::std::operator<<((ostream *)&meshPrim,
                                      "Invalid variability in RenderMesh.texcoord0");
          ::std::operator<<(poVar13,"\n");
          if (psVar23 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::operator+(&geomBindTransform._name,&skel_name,"\n");
            ::std::__cxx11::string::append((string *)psVar23);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&meshPrim);
          GeomPrimvar::~GeomPrimvar(&displayColorPvar);
          ::std::
          _Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
          ~_Vector_base((_Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                         *)&displayColor);
          goto LAB_002760ef;
        }
        GeomPrimvar::set_interpolation(&displayColorPvar,IVar25);
        GPrim::set_primvar(&mesh.super_GPrim,&displayColorPvar,(string *)0x0);
        GeomPrimvar::~GeomPrimvar(&displayColorPvar);
        ::std::
        _Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>::
        ~_Vector_base((_Vector_base<tinyusdz::value::texcoord2f,_std::allocator<tinyusdz::value::texcoord2f>_>
                       *)&displayColor);
      }
      if ((((this_04->joint_and_weights).jointIndices.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            (this_04->joint_and_weights).jointIndices.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_start) &&
          ((this_04->joint_and_weights).jointWeights.
           super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_finish !=
           (this_04->joint_and_weights).jointWeights.
           super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start)) && (0 < (this_04->joint_and_weights).elementSize)) {
        GeomPrimvar::GeomPrimvar(&displayColorPvar);
        ::std::__cxx11::string::string
                  ((string *)&meshPrim,"skel:jointWeights",(allocator *)&geomBindTransform);
        ::std::__cxx11::string::_M_assign((string *)&displayColorPvar);
        ::std::__cxx11::string::_M_dispose();
        GeomPrimvar::set_value<std::vector<float,std::allocator<float>>>
                  (&displayColorPvar,&(this_04->joint_and_weights).jointWeights);
        GeomPrimvar::set_elementSize(&displayColorPvar,(this_04->joint_and_weights).elementSize);
        GeomPrimvar::set_interpolation(&displayColorPvar,Vertex);
        GPrim::set_primvar(&mesh.super_GPrim,&displayColorPvar,(string *)0x0);
        GeomPrimvar::GeomPrimvar((GeomPrimvar *)&meshPrim);
        ::std::__cxx11::string::string
                  ((string *)&geomBindTransform,"skel:jointIndices",(allocator *)&skel_name);
        ::std::__cxx11::string::_M_assign((string *)&meshPrim);
        ::std::__cxx11::string::_M_dispose();
        GeomPrimvar::set_value<std::vector<int,std::allocator<int>>>
                  ((GeomPrimvar *)&meshPrim,&(this_04->joint_and_weights).jointIndices);
        GeomPrimvar::set_elementSize
                  ((GeomPrimvar *)&meshPrim,(this_04->joint_and_weights).elementSize);
        GeomPrimvar::set_interpolation((GeomPrimvar *)&meshPrim,Vertex);
        GPrim::set_primvar(&mesh.super_GPrim,(GeomPrimvar *)&meshPrim,(string *)0x0);
        GeomPrimvar::GeomPrimvar(&geomBindTransform);
        ::std::__cxx11::string::string
                  ((string *)&skel_name,"skel:geomBindTransform",(allocator *)&displayColor);
        ::std::__cxx11::string::_M_assign((string *)&geomBindTransform);
        ::std::__cxx11::string::_M_dispose();
        GeomPrimvar::set_value<tinyusdz::value::matrix4d>
                  (&geomBindTransform,&(this_04->joint_and_weights).geomBindTransform);
        GPrim::set_primvar(&mesh.super_GPrim,&geomBindTransform,(string *)0x0);
        GeomPrimvar::~GeomPrimvar(&geomBindTransform);
        GeomPrimvar::~GeomPrimvar((GeomPrimvar *)&meshPrim);
        GeomPrimvar::~GeomPrimvar(&displayColorPvar);
      }
      TypedAttributeWithFallback<bool>::operator=
                (&mesh.super_GPrim.doubleSided,&this_04->doubleSided);
      if (this_04->is_rightHanded == false) {
        displayColorPvar._name._M_dataplus._M_p._0_4_ = 1;
        TypedAttributeWithFallback<tinyusdz::Orientation>::set_value
                  (&mesh.super_GPrim.orientation,(Orientation *)&displayColorPvar);
      }
      iVar2 = this_04->material_id;
      if ((long)iVar2 < 0) {
        if ((this_04->material_subsetMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
        goto LAB_0027648e;
      }
      else {
        pRVar6 = (scene->materials).
                 super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        Relationship::Relationship((Relationship *)&displayColorPvar);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &geomBindTransform,"/materials/",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (pRVar6 + iVar2));
        ::std::__cxx11::string::string((string *)&skel_name,"",(allocator *)&displayColor);
        Path::Path(&meshPrim._abs_path,&geomBindTransform._name,&skel_name);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        Relationship::set((Relationship *)&displayColorPvar,&meshPrim._abs_path);
        nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                  (&mesh.super_GPrim.super_MaterialBinding.materialBinding,
                   (Relationship *)&displayColorPvar);
        Path::~Path(&meshPrim._abs_path);
        Relationship::~Relationship((Relationship *)&displayColorPvar);
        if ((this_04->material_subsetMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
LAB_0027648e:
          Token::Token((Token *)&displayColorPvar,"materialBind");
          pmVar15 = ::std::
                    map<tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType,_std::less<tinyusdz::Token>,_std::allocator<std::pair<const_tinyusdz::Token,_tinyusdz::GeomSubset::FamilyType>_>_>
                    ::operator[](&mesh.subsetFamilyTypeMap,(key_type *)&displayColorPvar);
          *pmVar15 = Unrestricted;
          ::std::__cxx11::string::_M_dispose();
          for (p_Var17 = (this_04->material_subsetMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_left;
              (_Rb_tree_header *)p_Var17 !=
              &(this_04->material_subsetMap)._M_t._M_impl.super__Rb_tree_header;
              p_Var17 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var17)) {
            GeomSubset::GeomSubset((GeomSubset *)&displayColorPvar);
            ::std::__cxx11::string::_M_assign(local_8248);
            displayColor.
            super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            displayColor.
            super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            displayColor.
            super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            pbVar28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            while( true ) {
              pp_Var16 = &p_Var17[6]._M_parent;
              if (p_Var17[6]._M_left == p_Var17[6]._M_parent) {
                pp_Var16 = &p_Var17[5]._M_left;
              }
              args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)pp_Var16[1] - (long)*pp_Var16 >> 2);
              if (args <= pbVar28) break;
              meshPrim._abs_path._prim_part._M_dataplus._M_p._0_4_ =
                   (&(*pp_Var16)->_M_color)[(long)pbVar28];
              ::std::vector<int,_std::allocator<int>_>::emplace_back<int>
                        ((vector<int,_std::allocator<int>_> *)&displayColor,(int *)&meshPrim);
              pbVar28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&(pbVar28->_M_dataplus)._M_p + 1);
            }
            Animatable<std::vector<int,_std::allocator<int>_>_>::Animatable
                      ((Animatable<std::vector<int,_std::allocator<int>_>_> *)&meshPrim,
                       (vector<int,_std::allocator<int>_> *)&displayColor);
            nonstd::optional_lite::
            optional<tinyusdz::Animatable<std::vector<int,std::allocator<int>>>>::operator=
                      (local_7b60,(Animatable<std::vector<int,_std::allocator<int>_>_> *)&meshPrim);
            Animatable<std::vector<int,_std::allocator<int>_>_>::~Animatable
                      ((Animatable<std::vector<int,_std::allocator<int>_>_> *)&meshPrim);
            Token::Token((Token *)&meshPrim,"materialBind");
            nonstd::optional_lite::optional<tinyusdz::Token>::operator=
                      ((optional<tinyusdz::Token> *)(local_7f00 + 0x148),(Token *)&meshPrim);
            ::std::__cxx11::string::_M_dispose();
            iVar2 = *(int *)&p_Var17[5]._M_parent;
            if ((long)iVar2 == -1) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&meshPrim);
              poVar13 = ::std::operator<<((ostream *)&meshPrim,"[error]");
              poVar13 = ::std::operator<<(poVar13,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                         );
              poVar13 = ::std::operator<<(poVar13,":");
              poVar13 = ::std::operator<<(poVar13,"ToGeomMesh");
              poVar13 = ::std::operator<<(poVar13,"():");
              poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x2fb);
              ::std::operator<<(poVar13," ");
              ::std::__cxx11::string::string
                        ((string *)&skel_name,"material_id is not assigned to material_subset {}",
                         (allocator *)&restTransforms);
              fmt::format<std::__cxx11::string>
                        ((string *)&geomBindTransform,(fmt *)&skel_name,(string *)(p_Var17 + 1),args
                        );
              poVar13 = ::std::operator<<((ostream *)&meshPrim,(string *)&geomBindTransform);
              ::std::operator<<(poVar13,"\n");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              if (psVar23 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+(&geomBindTransform._name,&skel_name,"\n");
                ::std::__cxx11::string::append((string *)psVar23);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&meshPrim);
            }
            else {
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &meshPrim,"/materials/",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((scene->materials).
                                super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                                ._M_impl.super__Vector_impl_data._M_start + iVar2));
              ::std::__cxx11::string::string((string *)&skel_name,"",(allocator *)&restTransforms);
              Path::Path((Path *)&geomBindTransform,(string *)&meshPrim,&skel_name);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              Relationship::Relationship((Relationship *)&meshPrim);
              Relationship::set((Relationship *)&meshPrim,(Path *)&geomBindTransform);
              nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                        ((optional<tinyusdz::Relationship> *)&displayColorPvar,
                         (Relationship *)&meshPrim);
              ::std::vector<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>::
              emplace_back<tinyusdz::GeomSubset>(&subsets,(GeomSubset *)&displayColorPvar);
              Relationship::~Relationship((Relationship *)&meshPrim);
              Path::~Path((Path *)&geomBindTransform);
            }
            ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&displayColor);
            GeomSubset::~GeomSubset((GeomSubset *)&displayColorPvar);
            if (iVar2 == -1) goto LAB_002760ef;
          }
        }
        this = &meshPrim._abs_path._prim_part._M_string_length;
        meshPrim._abs_path._prim_part._M_string_length = 0;
        meshPrim._abs_path._prim_part.field_2._M_allocated_capacity = 0;
        meshPrim._abs_path._prim_part.field_2._8_8_ = 0;
        meshPrim._abs_path._prim_part._M_dataplus._M_p._0_4_ = 4;
        geomBindTransform._name._M_dataplus._M_p =
             geomBindTransform._name._M_dataplus._M_p & 0xffffffff00000000;
        ::std::
        pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<tinyusdz::APISchemas::APIName,_const_char_(&)[1],_true>
                  ((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&displayColorPvar,(APIName *)&geomBindTransform,(char (*) [1])0x4a8b33);
        ::std::
        vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
        ::emplace_back<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>
                  ((vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
                    *)this,(pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&displayColorPvar);
        ::std::__cxx11::string::_M_dispose();
        nonstd::optional_lite::optional<tinyusdz::APISchemas>::operator=
                  (&mesh.super_GPrim.meta.apiSchemas,(APISchemas *)&meshPrim);
        ::std::
        vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)this);
      }
      ::std::_Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
      ~_Vector_base(&points.
                     super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                   );
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&bss);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&fvCounts.super__Vector_base<int,_std::allocator<int>_>);
      pRVar21 = (scene->meshes).
                super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = pRVar21[uVar22].skel_id;
      if ((long)(int)uVar3 < 0) {
        bVar30 = false;
      }
      else if ((ulong)(long)(int)uVar3 <
               (ulong)(((long)(scene->skeletons).
                              super__Vector_base<tinyusdz::tydra::SkelHierarchy,_std::allocator<tinyusdz::tydra::SkelHierarchy>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(scene->skeletons).
                             super__Vector_base<tinyusdz::tydra::SkelHierarchy,_std::allocator<tinyusdz::tydra::SkelHierarchy>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x1c8)) {
        skel_name._M_dataplus._M_p = (pointer)&skel_name.field_2;
        skel_name._M_string_length = 0;
        skel_name.field_2._M_local_buf[0] = '\0';
        skel_id = uVar3;
        sVar18 = ::std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::Skeleton>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::count(&skelMap._M_h,&skel_id);
        if (sVar18 == 0) {
          pSVar7 = (scene->skeletons).
                   super__Vector_base<tinyusdz::tydra::SkelHierarchy,_std::allocator<tinyusdz::tydra::SkelHierarchy>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar2 = (scene->meshes).
                  super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar22].skel_id;
          fvCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&fvCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
          fvCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          fvCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage =
               (pointer)((ulong)fvCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
          lVar26 = (long)pSVar7[iVar2].anim_id;
          if (-1 < lVar26) {
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &displayColorPvar,"/animations/",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((scene->animations).
                              super__Vector_base<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar26));
            ::std::__cxx11::string::operator=((string *)&fvCounts,(string *)&displayColorPvar);
            ::std::__cxx11::string::_M_dispose();
          }
          Skeleton::Skeleton((Skeleton *)&displayColorPvar);
          psVar23 = err_local;
          num_joints = 0;
          node = &pSVar7[iVar2].root_node;
          detail::CountNodes(node,&num_joints);
          sVar12 = num_joints;
          ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&bss,num_joints,
                     (allocator_type *)&meshPrim);
          ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&points,sVar12,
                     (allocator_type *)&meshPrim);
          ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
          vector((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                 &displayColor,sVar12,(allocator_type *)&meshPrim);
          ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
          vector((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                 &restTransforms.
                  super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                 ,sVar12,(allocator_type *)&meshPrim);
          bVar30 = detail::FlattenSkelNode
                             (node,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&bss
                              ,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&points,
                              (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                               *)&displayColor,
                              (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                               *)&restTransforms.
                                  super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                              ,psVar23);
          if (bVar30) {
            nonstd::optional_lite::
            optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>::operator=
                      (local_8488,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&bss)
            ;
            lVar11 = sVar12 + 1;
            lVar26 = 0;
            do {
              lVar11 = lVar11 + -1;
              if (lVar11 == 0) goto LAB_00276a90;
              bVar9 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&((bss.
                                                  super__Vector_base<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->name).
                                                  _M_dataplus._M_p + lVar26),
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&(points.
                                                  super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->x +
                                           lVar26));
              lVar26 = lVar26 + 0x20;
            } while (!bVar9);
            nonstd::optional_lite::
            optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>::operator=
                      (local_86d8,
                       (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&points);
LAB_00276a90:
            nonstd::optional_lite::
            optional<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
            ::operator=((optional<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
                         *)&displayColorPvar._ts_indices._samples.
                            super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                         *)&displayColor);
            nonstd::optional_lite::
            optional<std::vector<tinyusdz::value::matrix4d,std::allocator<tinyusdz::value::matrix4d>>>
            ::operator=(local_8238,
                        (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                         *)&restTransforms.
                            super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                       );
            if (fvCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish != (pointer)0x0) {
              ::std::__cxx11::string::string((string *)&meshPrim,"",&local_984d);
              Path::Path((Path *)&geomBindTransform,(string *)&fvCounts,(string *)&meshPrim);
              ::std::__cxx11::string::_M_dispose();
              Relationship::Relationship((Relationship *)&meshPrim);
              Relationship::set((Relationship *)&meshPrim,(Path *)&geomBindTransform);
              nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                        ((optional<tinyusdz::Relationship> *)local_7f00,(Relationship *)&meshPrim);
              Relationship::~Relationship((Relationship *)&meshPrim);
              Path::~Path((Path *)&geomBindTransform);
            }
            ::std::__cxx11::string::_M_assign
                      ((string *)
                       ((long)&displayColorPvar._attr._var._ts._samples.
                               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                               ._M_impl + 0x10));
            ::std::
            _Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
            ~_Vector_base(&restTransforms.
                           super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                         );
            ::std::
            _Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
            ~_Vector_base((_Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                           *)&displayColor);
            ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                      ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&points);
            ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                      ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&bss);
            ::std::__cxx11::string::_M_assign((string *)&skel_name);
            this_00 = &geomBindTransform._name._M_string_length;
            geomBindTransform._name.field_2._8_8_ = 0;
            geomBindTransform._name._M_string_length = 0;
            geomBindTransform._name.field_2._M_allocated_capacity = 0;
            geomBindTransform._name._M_dataplus._M_p._0_4_ = 4;
            bss.super__Vector_base<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(bss.
                                   super__Vector_base<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,0x11);
            ::std::
            pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<tinyusdz::APISchemas::APIName,_const_char_(&)[1],_true>
                      ((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&meshPrim,(APIName *)&bss,(char (*) [1])0x4a8b33);
            ::std::
            vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
            ::emplace_back<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>
                      ((vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
                        *)this_00,
                       (pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&meshPrim);
            ::std::__cxx11::string::_M_dispose();
            nonstd::optional_lite::optional<tinyusdz::APISchemas>::operator=
                      (local_7308,(APISchemas *)&geomBindTransform);
            this_02 = ::std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::Skeleton>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::Skeleton>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&skelMap,&skel_id);
            Skeleton::operator=(this_02,(Skeleton *)&displayColorPvar);
            ::std::
            vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector((vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)this_00);
            Skeleton::~Skeleton((Skeleton *)&displayColorPvar);
            ::std::__cxx11::string::_M_dispose();
            goto LAB_00276c19;
          }
          ::std::_Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
          ::~_Vector_base(&restTransforms.
                           super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                         );
          ::std::_Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
          ::~_Vector_base((_Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                           *)&displayColor);
          ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&points);
          ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&bss);
          Skeleton::~Skeleton((Skeleton *)&displayColorPvar);
          ::std::__cxx11::string::_M_dispose();
          bVar30 = false;
        }
        else {
          ::std::__detail::
          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::Skeleton>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::Skeleton>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        *)&skelMap._M_h,&skel_id);
          ::std::__cxx11::string::_M_assign((string *)&skel_name);
LAB_00276c19:
          Relationship::Relationship((Relationship *)&displayColorPvar);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &geomBindTransform,"/skelRoot/",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &skel_name);
          ::std::__cxx11::string::string((string *)&fvCounts,"",(allocator *)&bss);
          Path::Path(&meshPrim._abs_path,&geomBindTransform._name,(string *)&fvCounts);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          Relationship::set((Relationship *)&displayColorPvar,&meshPrim._abs_path);
          nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                    (&mesh.skeleton,(Relationship *)&displayColorPvar);
          fvCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          fvCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          fvCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)CONCAT44(fvCounts.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,4);
          bss.super__Vector_base<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(bss.
                                 super__Vector_base<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,0x11);
          ::std::
          pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::pair<tinyusdz::APISchemas::APIName,_const_char_(&)[1],_true>
                    ((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&geomBindTransform,(APIName *)&bss,(char (*) [1])0x4a8b33);
          ::std::
          vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
          ::emplace_back<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>
                    ((vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
                      *)&fvCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,
                     (pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&geomBindTransform);
          ::std::__cxx11::string::_M_dispose();
          if (mesh.super_GPrim.meta.apiSchemas.has_value_ == true) {
            pvVar19 = nonstd::optional_lite::optional<tinyusdz::APISchemas>::value
                                (&mesh.super_GPrim.meta.apiSchemas);
            bss.super__Vector_base<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(bss.
                                   super__Vector_base<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,0x11);
            ::std::
            pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<tinyusdz::APISchemas::APIName,_const_char_(&)[1],_true>
                      ((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&geomBindTransform,(APIName *)&bss,(char (*) [1])0x4a8b33);
            ::std::
            vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
            ::emplace_back<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>
                      ((vector<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>,std::allocator<std::pair<tinyusdz::APISchemas::APIName,std::__cxx11::string>>>
                        *)&pvVar19->names,
                       (pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&geomBindTransform);
            ::std::__cxx11::string::_M_dispose();
          }
          else {
            nonstd::optional_lite::optional<tinyusdz::APISchemas>::operator=
                      (&mesh.super_GPrim.meta.apiSchemas,(APISchemas *)&fvCounts);
          }
          ::std::
          vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector((vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&fvCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish);
          Path::~Path(&meshPrim._abs_path);
          Relationship::~Relationship((Relationship *)&displayColorPvar);
          bVar30 = true;
          bVar9 = true;
        }
        ::std::__cxx11::string::_M_dispose();
        if (!bVar30) {
          bVar30 = false;
          goto LAB_0027738a;
        }
        pRVar21 = (scene->meshes).
                  super__Vector_base<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        bVar30 = true;
      }
      else {
        bVar30 = false;
      }
      bss.super__Vector_base<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bss.super__Vector_base<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      bss.super__Vector_base<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (*(size_t *)((long)&pRVar21[uVar22].targets._M_t._M_impl + 0x28) != 0) {
        points.
        super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        displayColor.
        super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        points.
        super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        points.
        super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        displayColor.
        super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        displayColor.
        super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        p_Var20 = *(_Base_ptr *)((long)&pRVar21[uVar22].targets._M_t._M_impl + 0x18);
        while( true ) {
          if (p_Var20 == (_Rb_tree_node_base *)((long)&pRVar21[uVar22].targets._M_t._M_impl + 8U))
          break;
          BlendShape::BlendShape((BlendShape *)&displayColorPvar);
          ::std::__cxx11::string::_M_assign((string *)&displayColorPvar);
          if (p_Var20[4]._M_parent != (_Base_ptr)0x0) {
            nonstd::optional_lite::optional<std::__cxx11::string>::operator=
                      (local_8188,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var20 + 4));
          }
          lVar26 = (long)p_Var20[5]._M_parent - *(long *)(p_Var20 + 5);
          if (lVar26 != 0) {
            ::std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&meshPrim,lVar26 >> 2,
                       (allocator_type *)&geomBindTransform);
            lVar26 = *(long *)(p_Var20 + 5);
            lVar11 = *(long *)(p_Var20 + 6);
            p_Var8 = p_Var20[5]._M_right;
            for (lVar27 = 0; (lVar11 - (long)p_Var8) / 0xc != lVar27; lVar27 = lVar27 + 1) {
              *(undefined4 *)
               (CONCAT44(meshPrim._abs_path._prim_part._M_dataplus._M_p._4_4_,
                         (_Rb_tree_color)meshPrim._abs_path._prim_part._M_dataplus._M_p) +
               lVar27 * 4) = *(undefined4 *)(lVar26 + lVar27 * 4);
            }
            nonstd::optional_lite::optional<std::vector<int,std::allocator<int>>>::operator=
                      (local_8528,(vector<int,_std::allocator<int>_> *)&meshPrim);
            ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      ((_Vector_base<int,_std::allocator<int>_> *)&meshPrim);
          }
          lVar26 = *(long *)(p_Var20 + 6) - (long)p_Var20[5]._M_right;
          if (lVar26 != 0) {
            ::std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::
            vector((vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                   &meshPrim,lVar26 / 0xc,(allocator_type *)&geomBindTransform);
            p_Var8 = p_Var20[5]._M_right;
            lVar27 = (*(long *)(p_Var20 + 6) - (long)p_Var8) / 0xc;
            lVar11 = CONCAT44(meshPrim._abs_path._prim_part._M_dataplus._M_p._4_4_,
                              (_Rb_tree_color)meshPrim._abs_path._prim_part._M_dataplus._M_p);
            lVar26 = 8;
            while (bVar31 = lVar27 != 0, lVar27 = lVar27 + -1, bVar31) {
              *(undefined4 *)(lVar11 + -8 + lVar26) = *(undefined4 *)((long)p_Var8 + lVar26 + -8);
              *(undefined4 *)(lVar11 + -4 + lVar26) = *(undefined4 *)((long)p_Var8 + lVar26 + -4);
              *(undefined4 *)(lVar11 + lVar26) = *(undefined4 *)((long)&p_Var8->_M_color + lVar26);
              lVar26 = lVar26 + 0xc;
            }
            nonstd::optional_lite::
            optional<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
            ::operator=((optional<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
                         *)((long)&displayColorPvar._attr._metas.displayGroup.contained + 0x18),
                        (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                         *)&meshPrim);
            ::std::
            _Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::
            ~_Vector_base((_Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                           *)&meshPrim);
          }
          lVar26 = (long)p_Var20[6]._M_right - (long)p_Var20[6]._M_left;
          if (lVar26 != 0) {
            ::std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::
            vector((vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *)
                   &meshPrim,lVar26 / 0xc,(allocator_type *)&geomBindTransform);
            p_Var8 = p_Var20[6]._M_left;
            lVar27 = ((long)p_Var20[6]._M_right - (long)p_Var8) / 0xc;
            lVar11 = CONCAT44(meshPrim._abs_path._prim_part._M_dataplus._M_p._4_4_,
                              (_Rb_tree_color)meshPrim._abs_path._prim_part._M_dataplus._M_p);
            lVar26 = 8;
            while (bVar31 = lVar27 != 0, lVar27 = lVar27 + -1, bVar31) {
              *(undefined4 *)(lVar11 + -8 + lVar26) = *(undefined4 *)((long)p_Var8 + lVar26 + -8);
              *(undefined4 *)(lVar11 + -4 + lVar26) = *(undefined4 *)((long)p_Var8 + lVar26 + -4);
              *(undefined4 *)(lVar11 + lVar26) = *(undefined4 *)((long)&p_Var8->_M_color + lVar26);
              lVar26 = lVar26 + 0xc;
            }
            nonstd::optional_lite::
            optional<std::vector<tinyusdz::value::vector3f,std::allocator<tinyusdz::value::vector3f>>>
            ::operator=(local_8778,
                        (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                         *)&meshPrim);
            ::std::
            _Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::
            ~_Vector_base((_Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                           *)&meshPrim);
          }
          ::std::vector<tinyusdz::BlendShape,std::allocator<tinyusdz::BlendShape>>::
          emplace_back<tinyusdz::BlendShape&>
                    ((vector<tinyusdz::BlendShape,std::allocator<tinyusdz::BlendShape>> *)&bss,
                     (BlendShape *)&displayColorPvar);
          Token::Token((Token *)&meshPrim,(string *)(p_Var20 + 1));
          ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
          emplace_back<tinyusdz::Token>
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&points,
                     (Token *)&meshPrim);
          ::std::__cxx11::string::_M_dispose();
          geomBindTransform._name._M_dataplus._M_p = (pointer)&geomBindTransform._name.field_2;
          geomBindTransform._name._M_string_length = 0;
          geomBindTransform._name.field_2._M_allocated_capacity =
               geomBindTransform._name.field_2._M_allocated_capacity & 0xffffffffffffff00;
          if (bVar30) {
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &fvCounts,"/skelRoot/",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &mesh.super_GPrim.name);
          }
          else {
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &fvCounts,"/",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &mesh.super_GPrim.name);
          }
          ::std::operator+(&skel_name,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &fvCounts,"/");
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &meshPrim,&skel_name,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var20 + 1));
          ::std::__cxx11::string::operator=((string *)&geomBindTransform,(string *)&meshPrim);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::string((string *)&skel_name,"",(allocator *)&fvCounts);
          Path::Path(&meshPrim._abs_path,&geomBindTransform._name,&skel_name);
          ::std::__cxx11::string::_M_dispose();
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::push_back
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&displayColor,
                     &meshPrim._abs_path);
          Path::~Path(&meshPrim._abs_path);
          ::std::__cxx11::string::_M_dispose();
          BlendShape::~BlendShape((BlendShape *)&displayColorPvar);
          p_Var20 = (_Base_ptr)::std::_Rb_tree_increment(p_Var20);
        }
        Relationship::Relationship((Relationship *)&displayColorPvar);
        Relationship::set((Relationship *)&displayColorPvar,
                          (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&displayColor);
        nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                  (&mesh.blendShapeTargets,(Relationship *)&displayColorPvar);
        nonstd::optional_lite::
        optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>::operator=
                  ((optional<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>> *)
                   &mesh.blendShapes._attrib,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&points);
        Relationship::~Relationship((Relationship *)&displayColorPvar);
        ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&displayColor);
        ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&points);
      }
      Prim::Prim<tinyusdz::GeomMesh>(&meshPrim,&mesh);
      if (bss.super__Vector_base<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          bss.super__Vector_base<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_>.
          _M_impl.super__Vector_impl_data._M_start) {
LAB_00277213:
        if (subsets.super__Vector_base<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            subsets.super__Vector_base<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          uVar24 = 0xffffffffffffffff;
          lVar26 = 0;
          do {
            uVar24 = uVar24 + 1;
            if ((ulong)(((long)subsets.
                               super__Vector_base<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)subsets.
                              super__Vector_base<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x1568) <= uVar24)
            goto LAB_002772ad;
            prim_00 = (GeomSubset *)
                      (&((subsets.
                          super__Vector_base<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super_MaterialBinding).
                        materialBinding.has_value_ + lVar26);
            lVar26 = lVar26 + 0x1568;
            Prim::Prim<tinyusdz::GeomSubset>((Prim *)&displayColorPvar,prim_00);
            bVar31 = Prim::add_child(&meshPrim,(Prim *)&displayColorPvar,false,err_local);
            Prim::~Prim((Prim *)&displayColorPvar);
          } while (bVar31);
          goto LAB_00277297;
        }
LAB_002772ad:
        if (bVar30) {
          Prim::add_child(&skelRootPrim,&meshPrim,false,(string *)0x0);
        }
        else {
          Scope::Scope((Scope *)&displayColorPvar);
          ::std::__cxx11::to_string(&skel_name,uVar22);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &geomBindTransform,"scope",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &skel_name);
          ::std::__cxx11::string::operator=(local_8248,(string *)&geomBindTransform);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          Prim::Prim<tinyusdz::Scope>((Prim *)&geomBindTransform,(Scope *)&displayColorPvar);
          Prim::add_child((Prim *)&geomBindTransform,&meshPrim,true,(string *)0x0);
          Stage::add_root_prim(&stage,(Prim *)&geomBindTransform,true);
          Prim::~Prim((Prim *)&geomBindTransform);
          Scope::~Scope((Scope *)&displayColorPvar);
        }
        bVar30 = true;
      }
      else {
        uVar24 = 0xffffffffffffffff;
        lVar26 = 0;
        do {
          uVar24 = uVar24 + 1;
          if ((ulong)(((long)bss.
                             super__Vector_base<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)bss.
                            super__Vector_base<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0xbe8) <= uVar24)
          goto LAB_00277213;
          prim = (BlendShape *)
                 ((long)&((bss.
                           super__Vector_base<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_>
                           ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                 lVar26);
          lVar26 = lVar26 + 0xbe8;
          Prim::Prim<tinyusdz::BlendShape>((Prim *)&displayColorPvar,prim);
          bVar31 = Prim::add_child(&meshPrim,(Prim *)&displayColorPvar,false,err_local);
          Prim::~Prim((Prim *)&displayColorPvar);
        } while (bVar31);
LAB_00277297:
        bVar30 = false;
      }
      Prim::~Prim(&meshPrim);
      ::std::vector<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_>::~vector(&bss);
    }
    else {
      sVar12 = VertexAttribute::vertex_count(&this_04->vertex_colors);
      ::std::vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::vector
                (&displayColor,sVar12,(allocator_type *)&displayColorPvar);
      puVar5 = (this_04->vertex_colors).data.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar26 = 8;
      for (uVar24 = 0; sVar12 = VertexAttribute::vertex_count(&this_04->vertex_colors),
          uVar24 < sVar12; uVar24 = uVar24 + 1) {
        *(undefined4 *)
         ((long)displayColor.
                super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar26 + -8) =
             *(undefined4 *)(puVar5 + lVar26 + -8);
        *(undefined4 *)
         ((long)displayColor.
                super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar26 + -4) =
             *(undefined4 *)(puVar5 + lVar26 + -4);
        *(undefined4 *)
         ((long)&(displayColor.
                  super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                  ._M_impl.super__Vector_impl_data._M_start)->r + lVar26) =
             *(undefined4 *)(puVar5 + lVar26);
        lVar26 = lVar26 + 0xc;
      }
      GeomPrimvar::GeomPrimvar(&displayColorPvar);
      ::std::__cxx11::string::string
                ((string *)&meshPrim,"displayColor",(allocator *)&geomBindTransform);
      ::std::__cxx11::string::_M_assign((string *)&displayColorPvar);
      ::std::__cxx11::string::_M_dispose();
      GeomPrimvar::
      set_value<std::vector<tinyusdz::value::color3f,std::allocator<tinyusdz::value::color3f>>>
                (&displayColorPvar,
                 (vector<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_> *)
                 &displayColor.
                  super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                );
      VVar1 = (this_04->vertex_colors).variability;
      IVar25 = FaceVarying;
      if (((VVar1 == FaceVarying) || (IVar25 = Vertex, (VVar1 & ~Uniform) == Varying)) ||
         (IVar25 = Uniform, VVar1 == Constant)) {
        GeomPrimvar::set_interpolation(&displayColorPvar,IVar25);
        GPrim::set_primvar(&mesh.super_GPrim,&displayColorPvar,(string *)0x0);
        GeomPrimvar::~GeomPrimvar(&displayColorPvar);
        ::std::_Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::
        ~_Vector_base(&displayColor.
                       super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                     );
        goto LAB_00275a8b;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&meshPrim);
      poVar13 = ::std::operator<<((ostream *)&meshPrim,"[error]");
      poVar13 = ::std::operator<<(poVar13,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                 );
      poVar13 = ::std::operator<<(poVar13,":");
      poVar13 = ::std::operator<<(poVar13,"ToGeomMesh");
      poVar13 = ::std::operator<<(poVar13,"():");
      poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x262);
      ::std::operator<<(poVar13," ");
      poVar13 = ::std::operator<<((ostream *)&meshPrim,
                                  "Invalid variability in RenderMesh.vertex_colors");
      ::std::operator<<(poVar13,"\n");
      if (psVar23 != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::operator+(&geomBindTransform._name,&skel_name,"\n");
        ::std::__cxx11::string::append((string *)psVar23);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&meshPrim);
      GeomPrimvar::~GeomPrimvar(&displayColorPvar);
      ::std::_Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>::
      ~_Vector_base(&displayColor.
                     super__Vector_base<tinyusdz::value::color3f,_std::allocator<tinyusdz::value::color3f>_>
                   );
LAB_002760ef:
      ::std::_Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>::
      ~_Vector_base(&points.
                     super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                   );
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&bss);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&fvCounts.super__Vector_base<int,_std::allocator<int>_>);
      bVar30 = false;
    }
LAB_0027738a:
    ::std::vector<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>::~vector(&subsets);
    GeomMesh::~GeomMesh(&mesh);
    uVar22 = uVar22 + 1;
    if (!bVar30) goto LAB_00277857;
  }
  if (bVar9) {
    p_Var29 = &skelMap._M_h._M_before_begin;
    while (p_Var29 = p_Var29->_M_nxt, p_Var29 != (__node_base *)0x0) {
      Prim::Prim<tinyusdz::Skeleton>((Prim *)&mesh,(Skeleton *)(p_Var29 + 2));
      Prim::add_child(&skelRootPrim,(Prim *)&mesh,false,(string *)0x0);
      Prim::~Prim((Prim *)&mesh);
    }
    Stage::add_root_prim(&stage,&skelRootPrim,true);
  }
  Scope::Scope((Scope *)&displayColorPvar);
  ::std::__cxx11::string::assign((char *)local_8248);
  Prim::Prim<tinyusdz::Scope>(&meshPrim,(Scope *)&displayColorPvar);
  lVar26 = 0;
  for (uVar22 = 0;
      uVar22 < (ulong)(((long)(scene->animations).
                              super__Vector_base<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(scene->animations).
                             super__Vector_base<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0xc0); uVar22 = uVar22 + 1
      ) {
    SkelAnimation::SkelAnimation((SkelAnimation *)&mesh);
    bVar9 = detail::ExportSkelAnimation
                      ((Animation *)
                       ((long)&(((scene->animations).
                                 super__Vector_base<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->prim_name)._M_dataplus.
                               _M_p + lVar26),(SkelAnimation *)&mesh,err_local);
    if (!bVar9) {
      SkelAnimation::~SkelAnimation((SkelAnimation *)&mesh);
      Prim::~Prim(&meshPrim);
      this_03 = (GeomMesh *)&displayColorPvar;
      goto LAB_00277852;
    }
    Prim::Prim<tinyusdz::SkelAnimation>((Prim *)&geomBindTransform,(SkelAnimation *)&mesh);
    Prim::add_child(&meshPrim,(Prim *)&geomBindTransform,true,(string *)0x0);
    Prim::~Prim((Prim *)&geomBindTransform);
    SkelAnimation::~SkelAnimation((SkelAnimation *)&mesh);
    lVar26 = lVar26 + 0xc0;
  }
  Stage::add_root_prim(&stage,&meshPrim,true);
  Prim::~Prim(&meshPrim);
  Scope::~Scope((Scope *)&displayColorPvar);
  Scope::Scope((Scope *)&mesh);
  ::std::__cxx11::string::assign
            ((char *)&mesh.super_GPrim.super_MaterialBinding._materialBindingMap._M_t._M_impl.
                      super__Rb_tree_header);
  Prim::Prim<tinyusdz::Scope>(&meshPrim,(Scope *)&mesh);
  uVar22 = 0;
  while( true ) {
    if ((ulong)((long)(scene->materials).
                      super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(scene->materials).
                      super__Vector_base<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 8) <= uVar22) {
      Stage::add_root_prim(&stage,&meshPrim,true);
      Prim::~Prim(&meshPrim);
      Scope::~Scope((Scope *)&mesh);
      Stage::ExportToString_abi_cxx11_((string *)&mesh,&stage,false);
      ::std::__cxx11::string::operator=((string *)usda_str,(string *)&mesh);
      ::std::__cxx11::string::_M_dispose();
      bVar9 = true;
      goto LAB_00277859;
    }
    Model::Model((Model *)&displayColorPvar);
    Prim::Prim<tinyusdz::Model>((Prim *)&geomBindTransform,(Model *)&displayColorPvar);
    ::std::__cxx11::string::string((string *)&skel_name,"/materials",(allocator *)&fvCounts);
    psVar23 = err_local;
    bVar9 = detail::ToMaterialPrim(scene,&skel_name,uVar22,(Prim *)&geomBindTransform,err_local);
    ::std::__cxx11::string::_M_dispose();
    if (!bVar9) break;
    bVar9 = Prim::add_child(&meshPrim,(Prim *)&geomBindTransform,false,psVar23);
    if (!bVar9) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&skel_name);
      poVar13 = ::std::operator<<((ostream *)&skel_name,"[error]");
      poVar13 = ::std::operator<<(poVar13,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                 );
      poVar13 = ::std::operator<<(poVar13,":");
      poVar13 = ::std::operator<<(poVar13,"export_to_usda");
      poVar13 = ::std::operator<<(poVar13,"():");
      poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x5ab);
      ::std::operator<<(poVar13," ");
      ::std::__cxx11::string::string
                ((string *)&bss,"Failed to add child Prim: {}",(allocator *)&points);
      fmt::format<std::__cxx11::string*>
                ((string *)&fvCounts,(fmt *)&bss,(string *)&err_local,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)psVar23);
      poVar13 = ::std::operator<<((ostream *)&skel_name,(string *)&fvCounts);
      ::std::operator<<(poVar13,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      if (err_local != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &fvCounts,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bss,
                         "\n");
        ::std::__cxx11::string::append((string *)err_local);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&skel_name);
      break;
    }
    Prim::~Prim((Prim *)&geomBindTransform);
    Model::~Model((Model *)&displayColorPvar);
    uVar22 = uVar22 + 1;
  }
  Prim::~Prim((Prim *)&geomBindTransform);
  Model::~Model((Model *)&displayColorPvar);
  Prim::~Prim(&meshPrim);
  this_03 = &mesh;
LAB_00277852:
  Scope::~Scope((Scope *)this_03);
LAB_00277857:
  bVar9 = false;
LAB_00277859:
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_tinyusdz::Skeleton>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&skelMap._M_h);
  Prim::~Prim(&skelRootPrim);
  SkelRoot::~SkelRoot(&skelRoot);
  Stage::~Stage(&stage);
  return bVar9;
}

Assistant:

bool export_to_usda(const RenderScene &scene,
  std::string &usda_str, std::string *warn, std::string *err) {

  (void)warn;

  Stage stage;

  stage.metas().comment = "Exported from TinyUSDZ Tydra.";
  if (scene.meta.upAxis == "X") {
    stage.metas().upAxis = Axis::X;
  } else if (scene.meta.upAxis == "Y") {
    stage.metas().upAxis = Axis::Y;
  } else if (scene.meta.upAxis == "Z") {
    stage.metas().upAxis = Axis::Z;
  }

  SkelRoot skelRoot;
  skelRoot.set_name("skelRoot"); 
  Prim skelRootPrim(skelRoot);

  bool has_skelroot{false};

  // TODO: Construct Node hierarchy

  std::unordered_map<uint32_t, Skeleton> skelMap;

  for (size_t i = 0; i < scene.meshes.size(); i++) {
    GeomMesh mesh;
    std::vector<GeomSubset> subsets;
    if (!detail::ToGeomMesh(scene, scene.meshes[i], &mesh, &subsets, err)) {
      return false;
    }

    bool has_skel{false};

    if ((scene.meshes[i].skel_id > -1) && (size_t(scene.meshes[i].skel_id) < scene.skeletons.size())) {
      DCOUT("Export Skeleton");

      uint32_t skel_id = uint32_t(scene.meshes[i].skel_id);
      std::string skel_name;
      if (!skelMap.count(skel_id)) {
        const SkelHierarchy &src_skel = scene.skeletons[size_t(scene.meshes[i].skel_id)];

        std::string src_animsource; // empty = no animationSource
        if (src_skel.anim_id > -1) {
          src_animsource = "/animations/" + scene.animations[size_t(src_skel.anim_id)].prim_name;
        }

        Skeleton skel;
        if (!detail::ExportSkeleton(src_skel, src_animsource, &skel, err)) {
          return false;
        }
        skel_name = skel.name;

        APISchemas skelAPISchema;
        skelAPISchema.listOpQual = ListEditQual::Prepend;
        skelAPISchema.names.push_back({APISchemas::APIName::SkelBindingAPI, ""});
        skel.metas().apiSchemas = skelAPISchema;

        skelMap[skel_id] = std::move(skel);
      } else {
        skel_name = skelMap[skel_id].name;
      }

      has_skel = true;
      has_skelroot = true;

      // Add some skel settings to GeomMesh.
      
      // rel skel:skeleton
      Relationship skelRel;
      // FIXME: Set abs_path 
      Path skelTargetPath("/skelRoot/" + skel_name, "");
      skelRel.set(skelTargetPath);
      mesh.skeleton = skelRel;

    
      // Add apiSchemas both for GeomMesh and Skeleton
      //
      // prepend apiSchemas = ["SkelBindingAPI"]
      //
      APISchemas skelAPISchema;
      skelAPISchema.listOpQual = ListEditQual::Prepend;
      skelAPISchema.names.push_back({APISchemas::APIName::SkelBindingAPI, ""});
      if (mesh.metas().apiSchemas) {
        // Assume existing apiSchemas uses prepend listEditOp.
        mesh.metas().apiSchemas.value().names.push_back({APISchemas::APIName::SkelBindingAPI, ""});
      } else {
        mesh.metas().apiSchemas = skelAPISchema;
      }

    }

    std::vector<BlendShape> bss;
    if (scene.meshes[i].targets.size()) {

      std::vector<value::token> bsNames;
      std::vector<Path> bsTargetPaths;

      for (const auto &target : scene.meshes[i].targets) {
        BlendShape bs;
        if (!detail::ExportBlendShape(target.second, &bs, err)) {
          return false;
        }

        bss.emplace_back(bs);
        bsNames.push_back(value::token(target.first));
        // TODO: Set abs_path
        std::string bs_path;
        if (has_skel) {
          bs_path = "/skelRoot/" + mesh.name + "/" + target.first;
        } else {
          bs_path = "/" + mesh.name + "/" + target.first;
        }
        Path targetPath = Path(bs_path, "");
        bsTargetPaths.push_back(targetPath);
      }

      Relationship bsTargetRel;
      bsTargetRel.set(bsTargetPaths);

      mesh.blendShapeTargets = bsTargetRel;
      mesh.blendShapes.set_value(bsNames);

    }

    Prim meshPrim(mesh);

    // Add BlendShape prim under GeomMesh prim.
    if (bss.size()) {
      for (size_t t = 0; t < bss.size(); t++) {
        Prim bsPrim(bss[t]);
        if (!meshPrim.add_child(std::move(bsPrim), /* rename_primname_if_requred */false, err)) {
          return false;
        }
      }
    }

    // Add GeomSubset prim under GeomMesh prim.
    if (subsets.size()) {
      for (size_t s = 0; s < subsets.size(); s++) {
        Prim subsetPrim(subsets[s]);
        if (!meshPrim.add_child(std::move(subsetPrim), /* rename_primname_if_required */false, err)) {
          return false;
        }
      }
    }

    if (has_skel) {

      skelRootPrim.add_child(std::move(meshPrim), /* rename_primname_if_require */false);

    } else {
      // Put Prims under Scope Prim
      Scope scope;
      scope.name = "scope" + std::to_string(i);

      Prim scopePrim(scope);
      scopePrim.add_child(std::move(meshPrim));

      stage.add_root_prim(std::move(scopePrim));
    }

  }

  if (has_skelroot) {

    for (const auto &item : skelMap) {
      Prim skelPrim(item.second);
      skelRootPrim.add_child(std::move(skelPrim), /* rename_primname_if_require */false);
    }

    stage.add_root_prim(std::move(skelRootPrim));
  }

  // TODO: Move to SkelRoot
  {
    Scope animGroup;
    animGroup.name = "animations";

    Prim animGroupPrim(animGroup);

    for (size_t i = 0; i < scene.animations.size(); i++) {
      SkelAnimation skelAnim;
      if (!detail::ExportSkelAnimation(scene.animations[i], &skelAnim, err)) {
        return false;
      }

      // TODO: Put SkelAnimation under SkelRoot
      Prim prim(skelAnim);
      animGroupPrim.add_child(std::move(prim));
    }
    stage.add_root_prim(std::move(animGroupPrim));
  }

  {
    Scope matGroup;
    matGroup.name = "materials";

    Prim matGroupPrim(matGroup);

    DCOUT("export " << scene.materials.size() << " materials");

    for (size_t i = 0; i < scene.materials.size(); i++) {
      // init with dummy object(Model Prim)
      Model dummy;
      Prim matPrim(std::move(dummy));  
      if (!detail::ToMaterialPrim(scene, "/materials", i, &matPrim, err)) {
        return false;
      }
      if (!matGroupPrim.add_child(std::move(matPrim), /* rename_primname_if_required */false, err)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Failed to add child Prim: {}", err));
      }
      
    }
    stage.add_root_prim(std::move(matGroupPrim));
  }

  usda_str =stage.ExportToString();

  return true;
}